

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O1

int Abc_EsopAddLits(int *pCover,word r0,word r1,word r2,word Max,int Var)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  
  lVar5 = (long)r0 >> 0x20;
  iVar4 = (int)(r1 >> 0x20);
  iVar2 = (int)(r2 >> 0x20);
  cVar1 = (char)Var;
  if (Max == r0) {
    uVar3 = r2 >> 0x20;
    if (pCover != (int *)0x0) {
      if (0 < iVar4) {
        uVar6 = 0;
        do {
          pCover[uVar6] = pCover[lVar5 + uVar6];
          uVar6 = uVar6 + 1;
        } while (r1 >> 0x20 != uVar6);
      }
      if (0 < iVar2) {
        if (Var < 0) goto LAB_0042a3df;
        uVar6 = 0;
        do {
          pCover[((long)r1 >> 0x20) + uVar6] =
               pCover[((long)((r1 & 0xffffffff00000000) + r0) >> 0x20) + uVar6] |
               1 << (cVar1 * '\x02' & 0x1fU);
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
      }
    }
  }
  else if (Max == r1) {
    uVar3 = r2 >> 0x20;
    if (0 < iVar2 && pCover != (int *)0x0) {
      if (Var < 0) {
LAB_0042a3df:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf1,"int Abc_Var2Lit(int, int)");
      }
      uVar6 = 0;
      do {
        pCover[lVar5 + uVar6] =
             pCover[((long)((r0 & 0xffffffff00000000) + r1) >> 0x20) + uVar6] |
             2 << (cVar1 * '\x02' & 0x1fU);
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
  }
  else {
    iVar2 = (int)(r0 >> 0x20);
    if (pCover != (int *)0x0) {
      if (iVar2 != 0 && -1 < (long)r0) {
        if (Var < 0) goto LAB_0042a3df;
        uVar3 = 0;
        do {
          pCover[uVar3] = pCover[uVar3] | 1 << (cVar1 * '\x02' & 0x1fU);
          uVar3 = uVar3 + 1;
        } while (r0 >> 0x20 != uVar3);
      }
      if (iVar4 != 0 && -1 < (long)r1) {
        if (Var < 0) goto LAB_0042a3df;
        uVar3 = 0;
        do {
          pCover[lVar5 + uVar3] = pCover[lVar5 + uVar3] | 2 << (cVar1 * '\x02' & 0x1fU);
          uVar3 = uVar3 + 1;
        } while (r1 >> 0x20 != uVar3);
      }
    }
    uVar3 = (ulong)(uint)(iVar2 + iVar4);
  }
  return (int)uVar3;
}

Assistant:

static inline int Abc_EsopAddLits( int * pCover, word r0, word r1, word r2, word Max, int Var )
{
    int i, c0, c1, c2;
    if ( Max == r0 )
    {
        c2 = Abc_CostCubes(r2);
        if ( pCover )
        {
            c0 = Abc_CostCubes(r0);
            c1 = Abc_CostCubes(r1);
            for ( i = 0; i < c1; i++ )
                pCover[i] = pCover[c0+i];
            for ( i = 0; i < c2; i++ )
                pCover[c1+i] = pCover[c0+c1+i] | (1 << Abc_Var2Lit(Var,0));
        }
        return c2;
    }
    else if ( Max == r1 )
    {
        c2 = Abc_CostCubes(r2);
        if ( pCover )
        {
            c0 = Abc_CostCubes(r0);
            c1 = Abc_CostCubes(r1);
            for ( i = 0; i < c2; i++ )
                pCover[c0+i] = pCover[c0+c1+i] | (1 << Abc_Var2Lit(Var,1));
        }
        return c2;
    }
    else
    {
        c0 = Abc_CostCubes(r0);
        c1 = Abc_CostCubes(r1);
        if ( pCover )
        {
            c2 = Abc_CostCubes(r2);
            for ( i = 0; i < c0; i++ )
                pCover[i] |= (1 << Abc_Var2Lit(Var,0));
            for ( i = 0; i < c1; i++ )
                pCover[c0+i] |= (1 << Abc_Var2Lit(Var,1));
        }
        return c0 + c1;
    }
}